

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

int16_t modify_stat_value(wchar_t value,wchar_t amount)

{
  undefined4 local_14;
  wchar_t i;
  wchar_t amount_local;
  wchar_t value_local;
  
  i = value;
  if (amount < L'\x01') {
    if (amount < L'\0') {
      for (local_14 = 0; SBORROW4(local_14,-amount) != local_14 + amount < 0;
          local_14 = local_14 + 1) {
        if (i < L'\x1c') {
          if (i < L'\x13') {
            if (L'\x03' < i) {
              i = i + L'\xffffffff';
            }
          }
          else {
            i = L'\x12';
          }
        }
        else {
          i = i + L'\xfffffff6';
        }
      }
    }
  }
  else {
    for (local_14 = L'\0'; local_14 < amount; local_14 = local_14 + L'\x01') {
      if (i < L'\x12') {
        i = i + L'\x01';
      }
      else {
        i = i + L'\n';
      }
    }
  }
  return (int16_t)i;
}

Assistant:

int16_t modify_stat_value(int value, int amount)
{
	int i;

	/* Reward or penalty */
	if (amount > 0) {
		/* Apply each point */
		for (i = 0; i < amount; i++) {
			/* One point at a time */
			if (value < 18) value++;

			/* Ten "points" at a time */
			else value += 10;
		}
	} else if (amount < 0) {
		/* Apply each point */
		for (i = 0; i < (0 - amount); i++) {
			/* Ten points at a time */
			if (value >= 18+10) value -= 10;

			/* Hack -- prevent weirdness */
			else if (value > 18) value = 18;

			/* One point at a time */
			else if (value > 3) value--;
		}
	}

	/* Return new value */
	return (value);
}